

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_156e64f::HandleExportAndroidMKMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  int iVar3;
  string *psVar4;
  long lVar5;
  cmGlobalGenerator *pcVar6;
  cmExportSet *pcVar7;
  string *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_4;
  string *__args_5;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  undefined1 local_3d4;
  bool local_3d3;
  undefined1 local_3d2;
  bool exportOld;
  string fname;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_3b0;
  MessageLevel message;
  string local_3a0;
  string local_380;
  string exp;
  undefined1 local_330 [8];
  string filename;
  string name_space;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  Helper helper;
  string local_278;
  char *local_258;
  undefined8 local_250;
  size_type local_248;
  pointer local_240;
  undefined8 local_238;
  undefined8 local_230;
  char *local_228;
  undefined8 local_220;
  ParseResult local_218;
  cmInstallCommandArguments ica;
  
  Helper::Helper(&helper,status);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,helper.DefaultComponentName._M_dataplus._M_p,
             helper.DefaultComponentName._M_dataplus._M_p +
             helper.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  exp._M_string_length = 0;
  exp.field_2._M_local_buf[0] = '\0';
  name_space._M_dataplus._M_p = (pointer)&name_space.field_2;
  name_space._M_string_length = 0;
  name_space.field_2._M_local_buf[0] = '\0';
  exportOld = false;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  name.super_string_view._M_str = "EXPORT_ANDROID_MK";
  name.super_string_view._M_len = 0x11;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(&ica.super_cmArgumentParser<void>,name,&exp);
  name_00.super_string_view._M_str = "NAMESPACE";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_00,&name_space);
  name_01.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
  name_01.super_string_view._M_len = 0x1f;
  cmArgumentParser<void>::Bind<bool>(&ica.super_cmArgumentParser<void>,name_01,&exportOld);
  name_02.super_string_view._M_str = "FILE";
  name_02.super_string_view._M_len = 4;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_02,&filename);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_218,&ica.super_cmArgumentParser<void>,args,&unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar2) {
      psVar4 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar4->_M_string_length == 0) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_278._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        local_278._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_278.field_2._M_allocated_capacity = 0;
        local_278.field_2._8_8_ = 0x16;
        local_258 = " given no DESTINATION!";
        local_250 = 0;
        views_01._M_len = 2;
        views_01._M_array = (iterator)&local_278;
        cmCatViews(&fname,views_01);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_003ffd92;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fname,filename._M_dataplus._M_p,
                 filename._M_dataplus._M_p + filename._M_string_length);
      lVar5 = std::__cxx11::string::find_first_of((char *)&fname,0x8c8933,0);
      if (lVar5 == -1) {
        if (fname._M_string_length == 0) {
          bVar2 = false;
        }
        else {
          cmsys::SystemTools::GetFilenameLastExtension(&local_380,&fname);
          iVar3 = std::__cxx11::string::compare((char *)&local_380);
          bVar2 = iVar3 != 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_278._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
          local_278._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
          local_278.field_2._M_allocated_capacity = 0;
          local_278.field_2._8_8_ = 0x21;
          local_258 = " given invalid export file name \"";
          local_250 = 0;
          local_248 = fname._M_string_length;
          local_240 = fname._M_dataplus._M_p;
          local_238 = 0;
          local_230 = 0x3a;
          local_228 = "\".  The FILE argument must specify a name ending in \".mk\".";
          local_220 = 0;
          views_02._M_len = 4;
          views_02._M_array = (iterator)&local_278;
          cmCatViews(&local_3a0,views_02);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          local_380._M_dataplus._M_p = local_3a0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) goto LAB_0040014d;
          goto LAB_00400155;
        }
        lVar5 = std::__cxx11::string::find_first_of((char *)&fname,0x8c8933,0);
        if (lVar5 != -1) {
          cmStrCat<std::__cxx11::string_const&,char_const(&)[21],std::__cxx11::string&,char_const(&)[144]>
                    (&local_278,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (char (*) [21])" given export name \"",&exp,
                     (char (*) [144])
                     "\".  This name cannot be safely converted to a file name.  Specify a different export name or use the FILE option to set a file name explicitly."
                    );
          std::__cxx11::string::_M_assign((string *)&status->Error);
          local_3a0.field_2._M_allocated_capacity = local_278.field_2._M_allocated_capacity;
          local_380._M_dataplus._M_p = local_278._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) goto LAB_0040014d;
          goto LAB_00400155;
        }
        if (fname._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)&fname,"Android.mk");
        }
        pcVar6 = cmMakefile::GetGlobalGenerator(helper.Makefile);
        pcVar7 = cmExportSetMap::operator[](&pcVar6->ExportSets,&exp);
        message = cmInstallGenerator::SelectMessageLevel(helper.Makefile,false);
        this = helper.Makefile;
        local_330 = (undefined1  [8])pcVar7;
        psVar4 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        __args_3 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        __args_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        __args_5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        local_3d2 = cmInstallCommandArguments::GetExcludeFromAll(&ica);
        local_3d3 = true;
        local_3d4 = 0;
        cmMakefile::GetBacktrace(helper.Makefile);
        std::
        make_unique<cmInstallExportGenerator,cmExportSet*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[1],bool&,bool,bool,cmListFileBacktrace>
                  ((cmExportSet **)&local_3a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   psVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)__args_3,__args_4,(MessageLevel *)__args_5,(bool *)&message,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d2,
                   &fname,(char (*) [1])&name_space,(bool *)0x91dca5,&exportOld,&local_3d3,
                   (cmListFileBacktrace *)&local_3d4);
        local_3b0._M_head_impl = (cmInstallGenerator *)local_3a0._M_dataplus._M_p;
        local_3a0._M_dataplus._M_p = (pointer)0x0;
        cmMakefile::AddInstallGenerator
                  (this,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                        &local_3b0);
        if (local_3b0._M_head_impl != (cmInstallGenerator *)0x0) {
          (*((local_3b0._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
        }
        local_3b0._M_head_impl = (cmInstallGenerator *)0x0;
        if ((long *)local_3a0._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_3a0._M_dataplus._M_p + 8))();
        }
        local_3a0._M_dataplus._M_p = (pointer)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
        }
        bVar2 = true;
      }
      else {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_278._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        local_278._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_278.field_2._M_allocated_capacity = 0;
        local_278.field_2._8_8_ = 0x21;
        local_258 = " given invalid export file name \"";
        local_250 = 0;
        local_248 = fname._M_string_length;
        local_240 = fname._M_dataplus._M_p;
        local_238 = 0;
        local_230 = 0x5c;
        local_228 = 
        "\".  The FILE argument may not contain a path.  Specify the path in the DESTINATION argument."
        ;
        local_220 = 0;
        views_00._M_len = 4;
        views_00._M_array = (iterator)&local_278;
        cmCatViews(&local_380,views_00);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        local_3a0.field_2._M_allocated_capacity = local_380.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
LAB_0040014d:
          operator_delete(local_380._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
LAB_00400155:
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003ffecd;
    }
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_278._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
    local_278._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
    local_278.field_2._M_allocated_capacity = 0;
    local_278.field_2._8_8_ = 0x19;
    local_258 = " given unknown argument \"";
    local_250 = 0;
    local_240 = ((unknownArgs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_248 = (unknownArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_238 = 0;
    local_230 = 2;
    local_228 = "\".";
    local_220 = 0;
    views._M_len = 4;
    views._M_array = (iterator)&local_278;
    cmCatViews(&fname,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003ffd92:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fname._M_dataplus._M_p != &fname.field_2) {
      operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = false;
LAB_003ffecd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,
                    CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                             filename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_space._M_dataplus._M_p != &name_space.field_2) {
    operator_delete(name_space._M_dataplus._M_p,
                    CONCAT71(name_space.field_2._M_allocated_capacity._1_7_,
                             name_space.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp._M_dataplus._M_p != &exp.field_2) {
    operator_delete(exp._M_dataplus._M_p,
                    CONCAT71(exp.field_2._M_allocated_capacity._1_7_,exp.field_2._M_local_buf[0]) +
                    1);
  }
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)helper.DefaultComponentName._M_dataplus._M_p != &helper.DefaultComponentName.field_2) {
    operator_delete(helper.DefaultComponentName._M_dataplus._M_p,
                    helper.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool HandleExportAndroidMKMode(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
#ifndef CMAKE_BOOTSTRAP
  Helper helper(status);

  // This is the EXPORT mode.
  cmInstallCommandArguments ica(helper.DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;

  ica.Bind("EXPORT_ANDROID_MK"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(cmStrCat(args[0], " given invalid export file name \"",
                             fname,
                             "\".  The FILE argument may not contain a path.  "
                             "Specify the path in the DESTINATION argument."));
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".mk") {
    status.SetError(cmStrCat(
      args[0], " given invalid export file name \"", fname,
      R"(".  The FILE argument must specify a name ending in ".mk".)"));
    return false;
  }
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(
      cmStrCat(args[0], " given export name \"", exp,
               "\".  "
               "This name cannot be safely converted to a file name.  "
               "Specify a different export name or use the FILE option to set "
               "a file name explicitly."));
    return false;
  }
  // Use the default name
  if (fname.empty()) {
    fname = "Android.mk";
  }

  cmExportSet& exportSet =
    helper.Makefile->GetGlobalGenerator()->GetExportSets()[exp];

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);

  // Create the export install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallExportGenerator>(
      &exportSet, ica.GetDestination(), ica.GetPermissions(),
      ica.GetConfigurations(), ica.GetComponent(), message,
      ica.GetExcludeFromAll(), fname, name_space, "", exportOld, true, false,
      helper.Makefile->GetBacktrace()));

  return true;
#else
  static_cast<void>(args);
  status.SetError("EXPORT_ANDROID_MK not supported in bootstrap cmake");
  return false;
#endif
}